

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitBlock(ParseNodeBlock *pnodeBlock,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,
              BOOL fReturnValue)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ParseNodeBin *pPVar4;
  bool local_61;
  bool local_41;
  ParseNode *stmt;
  ParseNode *pnodeLastValStmt;
  ParseNode *pnode;
  BOOL fReturnValue_local;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNodeBlock *pnodeBlock_local;
  
  if ((pnodeBlock->super_ParseNodeStmt).super_ParseNode.nop != knopBlock) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x39c,"(pnodeBlock->nop == knopBlock)","pnodeBlock->nop == knopBlock");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pnodeLastValStmt = pnodeBlock->pnodeStmt;
  if (pnodeLastValStmt != (ParseNodePtr)0x0) {
    BeginEmitBlock(pnodeBlock,byteCodeGenerator,funcInfo);
    stmt = pnodeBlock->pnodeLastValStmt;
    while (pnodeLastValStmt->nop == knopList) {
      pPVar4 = ParseNode::AsParseNodeBin(pnodeLastValStmt);
      if (pPVar4->pnode1 == stmt) {
        stmt = (ParseNode *)0x0;
      }
      local_41 = fReturnValue != 0 && stmt == (ParseNode *)0x0;
      ByteCodeGenerator::EmitTopLevelStatement
                (byteCodeGenerator,pPVar4->pnode1,funcInfo,(uint)local_41);
      pPVar4 = ParseNode::AsParseNodeBin(pnodeLastValStmt);
      pnodeLastValStmt = pPVar4->pnode2;
    }
    if (pnodeLastValStmt == stmt) {
      stmt = (ParseNode *)0x0;
    }
    local_61 = fReturnValue != 0 && stmt == (ParseNode *)0x0;
    ByteCodeGenerator::EmitTopLevelStatement
              (byteCodeGenerator,pnodeLastValStmt,funcInfo,(uint)local_61);
    EndEmitBlock(pnodeBlock,byteCodeGenerator,funcInfo);
  }
  return;
}

Assistant:

void EmitBlock(ParseNodeBlock *pnodeBlock, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo, BOOL fReturnValue)
{
    Assert(pnodeBlock->nop == knopBlock);
    ParseNode *pnode = pnodeBlock->pnodeStmt;
    if (pnode == nullptr)
    {
        return;
    }

    BeginEmitBlock(pnodeBlock, byteCodeGenerator, funcInfo);

    ParseNode *pnodeLastValStmt = pnodeBlock->pnodeLastValStmt;

    while (pnode->nop == knopList)
    {
        ParseNode* stmt = pnode->AsParseNodeBin()->pnode1;
        if (stmt == pnodeLastValStmt)
        {
            // This is the last guaranteed return value, so any potential return values have to be
            // copied to the return register from this point forward.
            pnodeLastValStmt = nullptr;
        }
        byteCodeGenerator->EmitTopLevelStatement(stmt, funcInfo, fReturnValue && (pnodeLastValStmt == nullptr));
        pnode = pnode->AsParseNodeBin()->pnode2;
    }

    if (pnode == pnodeLastValStmt)
    {
        pnodeLastValStmt = nullptr;
    }
    byteCodeGenerator->EmitTopLevelStatement(pnode, funcInfo, fReturnValue && (pnodeLastValStmt == nullptr));

    EndEmitBlock(pnodeBlock, byteCodeGenerator, funcInfo);
}